

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O2

void __thiscall banksia::ChessBoard::takeBack(ChessBoard *this)

{
  value_type hist;
  Hist HStack_a8;
  
  Hist::Hist(&HStack_a8,
             (this->super_BoardCore).histList.
             super__Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_>._M_impl.
             super__Vector_impl_data._M_finish + -1);
  std::vector<banksia::Hist,_std::allocator<banksia::Hist>_>::pop_back
            (&(this->super_BoardCore).histList);
  (this->super_BoardCore).side = (uint)((this->super_BoardCore).side != white);
  (*(this->super_BoardCore).super_Obj._vptr_Obj[0x16])(this,&HStack_a8);
  Hist::~Hist(&HStack_a8);
  return;
}

Assistant:

void ChessBoard::takeBack() {
    auto hist = histList.back();
    histList.pop_back();
    side = getXSide(side);
    takeBack(hist);
    //    hashKey = hist.hashKey;
    assert(hashKey == initHashKey());
}